

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::parse
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,string_t *file_name)

{
  string_t *__rhs;
  tag_t<cfgfile::string_trait_t> *ptVar1;
  pointer pcVar2;
  tag_t<cfgfile::string_trait_t> **pptVar3;
  bool bVar4;
  int iVar5;
  _Elt_pointer pptVar6;
  undefined4 extraout_var;
  exception_t<cfgfile::string_trait_t> *this_00;
  _Elt_pointer pptVar7;
  pos_t pos;
  lexeme_t<cfgfile::string_trait_t> lexeme;
  undefined1 local_2c8 [8];
  _Alloc_hider local_2c0;
  undefined1 local_2b8 [24];
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined4 local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  *local_280;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  undefined1 *local_258;
  long local_250;
  undefined1 local_248 [16];
  undefined1 *local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  lexeme_t<cfgfile::string_trait_t> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string_t local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar4 = start_first_tag_parsing(this);
  if (bVar4) {
    lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(&local_1f8,&this->m_lex);
    if (local_1f8.m_type != null) {
      local_280 = &(this->super_parser_base_t<cfgfile::string_trait_t>).m_stack;
      __rhs = &local_1f8.m_value;
      do {
        pptVar6 = (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
                  super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar6 ==
            (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
            super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
          local_278 = local_268;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,
                     "Unexpected content. We\'ve finished parsing, but we\'ve got this: \"","");
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,local_278,local_278 + local_270);
          std::operator+(&local_f0,&local_130,__rhs);
          local_170 = local_160;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"\". ","");
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,local_170,local_170 + local_168);
          std::operator+(&local_d0,&local_f0,&local_150);
          local_218 = local_208;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"In file \"","");
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_190,local_218,local_218 + local_210);
          std::operator+(&local_b0,&local_d0,&local_190);
          std::operator+(&local_90,&local_b0,file_name);
          local_238 = local_228;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"\" on line ","");
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,local_238,local_238 + local_230);
          std::operator+(&local_70,&local_90,&local_1b0);
          string_trait_t::to_string_abi_cxx11_
                    (&local_110,(string_trait_t *)(this->m_lex).m_line_number,pos);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c8,&local_70,&local_110);
          local_258 = local_248;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,".","");
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,local_258,local_258 + local_250);
          std::operator+(&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c8,&local_1d0);
          exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_50);
          __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                      exception_t<cfgfile::string_trait_t>::~exception_t);
        }
        if (local_1f8.m_type == start) {
          if (pptVar6 ==
              (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
              super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar3 = (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
                      super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            pptVar7 = pptVar3 + 0x3f;
            pptVar6 = pptVar3 + 0x40;
          }
          else {
            pptVar7 = pptVar6 + -1;
          }
          ptVar1 = *pptVar7;
          iVar5 = (*pptVar6[-1]->_vptr_tag_t[2])();
          start_tag_parsing(this,ptVar1,(child_tags_list_t *)CONCAT44(extraout_var,iVar5));
        }
        else if (local_1f8.m_type == finish) {
          if (pptVar6 ==
              (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
              super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar6 = (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
                      super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          ptVar1 = pptVar6[-1];
          local_298 = (undefined4)(this->m_lex).m_line_number;
          uStack_294 = *(undefined4 *)((long)&(this->m_lex).m_line_number + 4);
          uStack_290 = (undefined4)(this->m_lex).m_column_number;
          uStack_28c = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
          local_2c8 = (undefined1  [8])local_2b8;
          pcVar2 = (file_name->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2c8,pcVar2,pcVar2 + file_name->_M_string_length);
          local_2b8._16_4_ = local_298;
          local_2b8._20_4_ = uStack_294;
          uStack_2a0 = uStack_290;
          uStack_29c = uStack_28c;
          (*ptVar1->_vptr_tag_t[5])(ptVar1,local_2c8);
          if (local_2c8 != (undefined1  [8])local_2b8) {
            operator_delete((void *)local_2c8,local_2b8._0_8_ + 1);
          }
          std::
          deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
          ::pop_back(&local_280->c);
        }
        else if (local_1f8.m_type == string) {
          if (pptVar6 ==
              (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
              super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar6 = (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
                      super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          ptVar1 = pptVar6[-1];
          local_298 = (undefined4)(this->m_lex).m_line_number;
          uStack_294 = *(undefined4 *)((long)&(this->m_lex).m_line_number + 4);
          uStack_290 = (undefined4)(this->m_lex).m_column_number;
          uStack_28c = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
          local_2c8 = (undefined1  [8])local_2b8;
          pcVar2 = (file_name->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2c8,pcVar2,pcVar2 + file_name->_M_string_length);
          local_2b8._16_4_ = local_298;
          local_2b8._20_4_ = uStack_294;
          uStack_2a0 = uStack_290;
          uStack_29c = uStack_28c;
          (*ptVar1->_vptr_tag_t[6])(ptVar1,local_2c8,__rhs);
          if (local_2c8 != (undefined1  [8])local_2b8) {
            operator_delete((void *)local_2c8,local_2b8._0_8_ + 1);
          }
        }
        lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme
                  ((lexeme_t<cfgfile::string_trait_t> *)local_2c8,&this->m_lex);
        local_1f8.m_type = local_2c8._0_4_;
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_2c0);
        if (local_2c0._M_p != local_2b8 + 8) {
          operator_delete(local_2c0._M_p,local_2b8._8_8_ + 1);
        }
      } while (local_1f8.m_type != null);
    }
    parser_base_t<cfgfile::string_trait_t>::check_parser_state_after_parsing
              (&this->super_parser_base_t<cfgfile::string_trait_t>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_value._M_dataplus._M_p != &local_1f8.m_value.field_2) {
      operator_delete(local_1f8.m_value._M_dataplus._M_p,
                      local_1f8.m_value.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void parse( const typename Trait::string_t & file_name ) override
	{
		if( !start_first_tag_parsing() )
			return;

		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		while( !lexeme.is_null() )
		{
			if( !this->m_stack.empty() )
			{
				switch( lexeme.type() )
				{
					case lexeme_type_t::start :
						start_tag_parsing( *this->m_stack.top(),
							this->m_stack.top()->children() );
						break;

					case lexeme_type_t::string :
						this->m_stack.top()->on_string( parser_info_t< Trait >(
								file_name,
								m_lex.line_number(),
								m_lex.column_number() ),
							lexeme.value() );
						break;

					case lexeme_type_t::finish :
					{
						this->m_stack.top()->on_finish( parser_info_t< Trait >(
							file_name,
							m_lex.line_number(),
							m_lex.column_number() ) );
						this->m_stack.pop();
					}
						break;

					default:
						break;
				}
			}
			else
				throw exception_t< Trait >(
					Trait::from_ascii( "Unexpected content. "
						"We've finished parsing, but we've got this: \"" ) +
					lexeme.value() + Trait::from_ascii( "\". " ) +
					Trait::from_ascii( "In file \"" ) + file_name +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( m_lex.line_number() ) +
					Trait::from_ascii( "." ) );


			lexeme = m_lex.next_lexeme();
		}

		this->check_parser_state_after_parsing();
	}